

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeTree.cpp
# Opt level: O0

bool __thiscall Indexing::CodeTree::RemovingMatcher<true>::next(RemovingMatcher<true> *this)

{
  CodeOp *op;
  BTPoint elem;
  bool bVar1;
  uint uVar2;
  CodeOp **ppCVar3;
  size_t fibDepth;
  long *in_RDI;
  bool shouldBacktrack;
  RemovingMatcher<true> *in_stack_ffffffffffffff98;
  undefined8 in_stack_ffffffffffffffa0;
  RemovingMatcher<true> *in_stack_ffffffffffffffa8;
  size_t tp;
  BTPoint local_30;
  byte local_11;
  
  if ((*(byte *)(in_RDI + 0x10) & 1) == 0) {
    bVar1 = backtrack(in_stack_ffffffffffffffa8);
    if (!bVar1) {
      return false;
    }
  }
  else {
    *(undefined1 *)(in_RDI + 0x10) = 0;
  }
  local_11 = 0;
LAB_00348ec9:
  do {
    ppCVar3 = CodeOp::alternative((CodeOp *)*in_RDI);
    if (*ppCVar3 != (CodeOp *)0x0) {
      tp = in_RDI[1];
      ppCVar3 = CodeOp::alternative((CodeOp *)*in_RDI);
      op = *ppCVar3;
      fibDepth = Lib::Stack<Indexing::CodeTree::CodeOp_*>::size
                           ((Stack<Indexing::CodeTree::CodeOp_*> *)in_RDI[0xf]);
      BTPoint::BTPoint(&local_30,tp,op,fibDepth);
      elem.op = (CodeOp *)in_stack_ffffffffffffffa8;
      elem.tp = in_stack_ffffffffffffffa0;
      elem.fibDepth = tp;
      in_stack_ffffffffffffff98 = (RemovingMatcher<true> *)local_30.fibDepth;
      Lib::Stack<Indexing::CodeTree::RemovingMatcher<true>::BTPoint>::push
                ((Stack<Indexing::CodeTree::RemovingMatcher<true>::BTPoint> *)local_30.op,elem);
    }
    uVar2 = CodeOp::_instruction((CodeOp *)0x348f63);
    in_stack_ffffffffffffffa8 = (RemovingMatcher<true> *)(ulong)uVar2;
    switch(in_stack_ffffffffffffffa8) {
    case (RemovingMatcher<true> *)0x0:
      bVar1 = CodeOp::isFail((CodeOp *)*in_RDI);
      if (bVar1) {
        local_11 = 1;
      }
      else {
        if ((*(byte *)(in_RDI + 0x16) & 1) == 0) {
          return true;
        }
        local_11 = 1;
      }
      break;
    case (RemovingMatcher<true> *)0x1:
      bVar1 = BaseMatcher::doCheckGroundTerm((BaseMatcher *)in_stack_ffffffffffffffa8);
      local_11 = (bVar1 ^ 0xffU) & 1;
      break;
    case (RemovingMatcher<true> *)0x2:
      return true;
    case (RemovingMatcher<true> *)0x3:
      bVar1 = doCheckFun(in_stack_ffffffffffffff98);
      local_11 = (bVar1 ^ 0xffU) & 1;
      break;
    case (RemovingMatcher<true> *)0x4:
      bVar1 = doAssignVar(in_stack_ffffffffffffffa8);
      local_11 = (bVar1 ^ 0xffU) & 1;
      break;
    case (RemovingMatcher<true> *)0x5:
      bVar1 = doCheckVar(in_stack_ffffffffffffffa8);
      local_11 = (bVar1 ^ 0xffU) & 1;
      break;
    case (RemovingMatcher<true> *)0x6:
      bVar1 = doSearchStruct(in_stack_ffffffffffffff98);
      if (bVar1) goto LAB_00348ec9;
      local_11 = 1;
    }
    if ((local_11 & 1) == 0) {
      *in_RDI = *in_RDI + 0x10;
    }
    else {
      bVar1 = backtrack(in_stack_ffffffffffffffa8);
      if (!bVar1) {
        return false;
      }
    }
  } while( true );
}

Assistant:

bool CodeTree::RemovingMatcher<checkRange>::next()
{
  if(fresh) {
    fresh=false;
  }
  else {
    //we backtrack from what we found in the previous run
    if(!backtrack()) {
      return false;
    }
  }


  bool shouldBacktrack=false;
  for(;;) {
    if(op->alternative()) {
      btStack.push(BTPoint(tp, op->alternative(), firstsInBlocks->size()));
    }
    switch(op->_instruction()) {
      case SUCCESS_OR_FAIL:
        if(op->isFail()) {
          shouldBacktrack=true;
          break;
        }
        if(matchingClauses) {
          //we can succeed only in certain depth and that will be handled separately
          shouldBacktrack=true;
        }
        else {
          //we are matching terms in a TermCodeTree
          return true;
        }
        break;
      case LIT_END:
        ASS(matchingClauses);
        return true;
      case CHECK_GROUND_TERM:
        shouldBacktrack=!doCheckGroundTerm();
        break;
      case CHECK_FUN:
        shouldBacktrack=!doCheckFun();
        break;
      case ASSIGN_VAR:
        shouldBacktrack=!doAssignVar();
        break;
      case CHECK_VAR:
        shouldBacktrack=!doCheckVar();
        break;
      case SEARCH_STRUCT:
        if(doSearchStruct()) {
          //a new value of @b op is assigned, so restart the loop
          continue;
        }
        else {
          shouldBacktrack=true;
        }
        break;
    }
    if(shouldBacktrack) {
      if(!backtrack()) {
        return false;
      }
      // dead store, left here in case it should have been a static?
      // shouldBacktrack = false;
    }
    else {
      //the SEARCH_STRUCT operation does not appear in CodeBlocks
      ASS(!op->isSearchStruct());
      //In each CodeBlock there is always either operation LIT_END or FAIL.
      //As we haven't encountered one yet, we may safely increase the
      //operation pointer
      op++;
    }
  }
}